

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O2

int ebur128_init_filter(ebur128_state *st)

{
  uint uVar1;
  ebur128_state_internal *peVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  filter_state *padVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  
  dVar13 = tan(5284.078578647628 /
               (((double)CONCAT44(0x45300000,(int)(st->samplerate >> 0x20)) - 1.9342813113834067e+25
                ) + ((double)CONCAT44(0x43300000,(int)st->samplerate) - 4503599627370496.0)));
  dVar22 = (dVar13 * 1.2587209302325617) / 0.7071752369554196;
  dVar16 = dVar13 * dVar13;
  dVar15 = tan(119.8061151453059 /
               (((double)CONCAT44(0x45300000,(int)(st->samplerate >> 0x20)) - 1.9342813113834067e+25
                ) + ((double)CONCAT44(0x43300000,(int)st->samplerate) - 4503599627370496.0)));
  dVar23 = dVar15 * dVar15 + -1.0;
  peVar2 = st->d;
  auVar17._8_8_ = dVar13;
  auVar17._0_8_ = dVar15;
  auVar18 = divpd(auVar17,_DAT_00108c80);
  peVar2->a[0] = 1.0;
  dVar24 = dVar15 * dVar15 + auVar18._0_8_ + 1.0;
  dVar13 = dVar13 * dVar13 + auVar18._8_8_ + 1.0;
  uVar11 = SUB84(dVar13,0);
  uVar12 = (undefined4)((ulong)dVar13 >> 0x20);
  auVar19._8_8_ = (1.0 - auVar18._8_8_) + dVar16;
  auVar19._0_8_ = dVar23 + dVar23;
  auVar20._8_4_ = uVar11;
  auVar20._0_8_ = dVar24;
  auVar20._12_4_ = uVar12;
  auVar20 = divpd(auVar19,auVar20);
  dVar23 = auVar20._0_8_;
  dVar21 = auVar20._8_8_;
  auVar14._0_8_ = (1.0 - auVar18._0_8_) + dVar15 * dVar15;
  auVar14._8_8_ = dVar16 + -1.0 + dVar16 + -1.0;
  auVar18._8_4_ = uVar11;
  auVar18._0_8_ = dVar24;
  auVar18._12_4_ = uVar12;
  auVar20 = divpd(auVar14,auVar18);
  dVar25 = (dVar22 + 1.5848647011308556 + dVar16) / dVar13;
  peVar2->b[0] = dVar25;
  auVar5._8_8_ = dVar16 + -1.5848647011308556 + dVar16 + -1.5848647011308556;
  auVar5._0_8_ = (1.5848647011308556 - dVar22) + dVar16;
  auVar3._8_4_ = uVar11;
  auVar3._0_8_ = dVar13;
  auVar3._12_4_ = uVar12;
  auVar18 = divpd(auVar5,auVar3);
  dVar24 = auVar18._8_8_;
  peVar2->b[1] = dVar24 - (dVar25 + dVar25);
  dVar15 = auVar18._0_8_;
  dVar13 = dVar24 - (dVar15 + dVar15);
  auVar4._8_4_ = SUB84(dVar13,0);
  auVar4._0_8_ = dVar15 + (dVar25 - (dVar24 + dVar24));
  auVar4._12_4_ = (int)((ulong)dVar13 >> 0x20);
  *(undefined1 (*) [16])(peVar2->b + 2) = auVar4;
  peVar2->b[4] = dVar15;
  dVar15 = auVar20._8_8_;
  dVar13 = auVar20._0_8_;
  peVar2->a[1] = dVar15 + dVar23;
  peVar2->a[2] = dVar15 * dVar23 + dVar13 + dVar21;
  peVar2->a[3] = dVar15 * dVar13 + dVar23 * dVar21;
  peVar2->a[4] = dVar21 * dVar13;
  uVar1 = st->channels;
  padVar7 = (filter_state *)malloc((ulong)uVar1 * 0x28);
  peVar2->v = padVar7;
  if (padVar7 == (filter_state *)0x0) {
    iVar6 = 1;
  }
  else {
    iVar6 = 0;
    uVar9 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar9 = 0;
    }
    for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
      for (lVar10 = 0; lVar10 != 5; lVar10 = lVar10 + 1) {
        (*padVar7)[lVar10] = 0.0;
      }
      padVar7 = padVar7 + 1;
    }
  }
  return iVar6;
}

Assistant:

static int ebur128_init_filter(ebur128_state* st) {
  int errcode = EBUR128_SUCCESS;
  int i, j;

  double f0 = 1681.974450955533;
  double G = 3.999843853973347;
  double Q = 0.7071752369554196;

  double K = tan(M_PI * f0 / (double) st->samplerate);
  double Vh = pow(10.0, G / 20.0);
  double Vb = pow(Vh, 0.4996667741545416);

  double pb[3] = { 0.0, 0.0, 0.0 };
  double pa[3] = { 1.0, 0.0, 0.0 };
  double rb[3] = { 1.0, -2.0, 1.0 };
  double ra[3] = { 1.0, 0.0, 0.0 };

  double a0 = 1.0 + K / Q + K * K;
  pb[0] = (Vh + Vb * K / Q + K * K) / a0;
  pb[1] = 2.0 * (K * K - Vh) / a0;
  pb[2] = (Vh - Vb * K / Q + K * K) / a0;
  pa[1] = 2.0 * (K * K - 1.0) / a0;
  pa[2] = (1.0 - K / Q + K * K) / a0;

  /* fprintf(stderr, "%.14f %.14f %.14f %.14f %.14f\n",
                     b1[0], b1[1], b1[2], a1[1], a1[2]); */

  f0 = 38.13547087602444;
  Q = 0.5003270373238773;
  K = tan(M_PI * f0 / (double) st->samplerate);

  ra[1] = 2.0 * (K * K - 1.0) / (1.0 + K / Q + K * K);
  ra[2] = (1.0 - K / Q + K * K) / (1.0 + K / Q + K * K);

  /* fprintf(stderr, "%.14f %.14f\n", a2[1], a2[2]); */

  st->d->b[0] = pb[0] * rb[0];
  st->d->b[1] = pb[0] * rb[1] + pb[1] * rb[0];
  st->d->b[2] = pb[0] * rb[2] + pb[1] * rb[1] + pb[2] * rb[0];
  st->d->b[3] = pb[1] * rb[2] + pb[2] * rb[1];
  st->d->b[4] = pb[2] * rb[2];

  st->d->a[0] = pa[0] * ra[0];
  st->d->a[1] = pa[0] * ra[1] + pa[1] * ra[0];
  st->d->a[2] = pa[0] * ra[2] + pa[1] * ra[1] + pa[2] * ra[0];
  st->d->a[3] = pa[1] * ra[2] + pa[2] * ra[1];
  st->d->a[4] = pa[2] * ra[2];

  st->d->v = (filter_state*) malloc(st->channels * sizeof(filter_state));
  CHECK_ERROR(!st->d->v, EBUR128_ERROR_NOMEM, exit);
  for (i = 0; i < (int) st->channels; ++i) {
    for (j = 0; j < FILTER_STATE_SIZE; ++j) {
      st->d->v[i][j] = 0.0;
    }
  }

exit:
  return errcode;
}